

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain
          (CompilerHLSL *this,string *expr,string *lhs,SPIRAccessChain *chain)

{
  __node_base_ptr *this_00;
  bool bVar1;
  uint32_t uVar2;
  CompilerError *pCVar3;
  ulong uVar4;
  spirv_cross local_940 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920 [8];
  string bitcast_op;
  uint local_8fc;
  spirv_cross local_8f8 [32];
  uint local_8d8;
  uint local_8d4;
  uint32_t r_1;
  uint32_t c_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0 [32];
  spirv_cross local_890 [32];
  undefined1 local_870 [8];
  SPIRType scalar_type_1;
  uint local_6fc;
  spirv_cross local_6f8 [36];
  uint local_6d4;
  string local_6d0 [4];
  uint32_t c;
  string local_6b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690 [32];
  spirv_cross local_670 [32];
  undefined1 local_650 [8];
  SPIRType vector_type;
  string local_4f8 [32];
  char *local_4d8;
  char *load_op_1;
  spirv_cross local_4c8 [36];
  uint local_4a4;
  string local_4a0 [4];
  uint32_t r;
  string local_480 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440 [32];
  spirv_cross local_420 [32];
  undefined1 local_400 [8];
  SPIRType scalar_type;
  allocator local_289;
  string local_288 [32];
  char *local_268;
  char *load_op;
  spirv_cross local_240 [32];
  string local_220 [8];
  string template_expr;
  string local_200 [8];
  string load_expr;
  string local_1d8 [3];
  bool templated_load;
  string base;
  allocator local_1b1;
  string local_1b0 [32];
  undefined4 local_190;
  undefined1 local_180 [8];
  SPIRType target_type;
  SPIRType *type;
  SPIRAccessChain *chain_local;
  string *lhs_local;
  string *expr_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).field_0xc);
  target_type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  SPIRType::SPIRType((SPIRType *)local_180);
  target_type.super_IVariant._vptr_IVariant._4_4_ = 8;
  target_type.super_IVariant._12_4_ =
       *(undefined4 *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4);
  target_type.width = *(uint32_t *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
  bVar1 = VectorView<unsigned_int>::empty
                    ((VectorView<unsigned_int> *)
                     (target_type.member_name_cache._M_h._M_single_bucket + 4));
  if (bVar1) {
    if (*(int *)((long)&target_type.member_name_cache._M_h._M_single_bucket[1]._M_nxt + 4) == 0xf) {
      read_access_chain_struct(this,lhs,chain);
      local_190 = 1;
    }
    else {
      if ((*(int *)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt != 0x20) &&
         (((this->hlsl_options).enable_16bit_types & 1U) == 0)) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1b0,
                   "Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
                   ,&local_1b1);
        CompilerError::CompilerError(pCVar3,(string *)local_1b0);
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::__cxx11::string::string(local_1d8,(string *)&chain->base);
      bVar1 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(chain->super_IVariant).self.id,DecorationNonUniform);
      if (bVar1) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).self);
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,(string *)local_1d8,uVar2);
      }
      bVar1 = 0x3d < (this->hlsl_options).shader_model;
      ::std::__cxx11::string::string(local_200);
      ::std::__cxx11::string::string(local_220);
      if (bVar1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&load_op,this,target_type.member_name_cache._M_h._M_single_bucket,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (local_240,(char (*) [2])0x5e6cd2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&load_op,
                   (char (*) [2])0x5f0ee9);
        ::std::__cxx11::string::operator=(local_220,(string *)local_240);
        ::std::__cxx11::string::~string((string *)local_240);
        ::std::__cxx11::string::~string((string *)&load_op);
      }
      if ((*(int *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt == 1) &&
         ((chain->row_major_matrix & 1U) == 0)) {
        local_268 = (char *)0x0;
        switch(*(undefined4 *)
                ((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4)) {
        case 1:
          local_268 = "Load";
          break;
        case 2:
          local_268 = "Load2";
          break;
        case 3:
          local_268 = "Load3";
          break;
        case 4:
          local_268 = "Load4";
          break;
        default:
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_288,"Unknown vector size.",&local_289);
          CompilerError::CompilerError(pCVar3,(string *)local_288);
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (bVar1) {
          local_268 = "Load";
        }
        join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[2]>
                  ((spirv_cross *)&scalar_type.member_name_cache._M_h._M_single_bucket,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   (char (*) [2])0x5ea727,&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                   (char (*) [2])0x601bd3,&chain->dynamic_index,&chain->static_index,
                   (char (*) [2])0x5eaa1a);
        ::std::__cxx11::string::operator=
                  (local_200,(string *)&scalar_type.member_name_cache._M_h._M_single_bucket);
        ::std::__cxx11::string::~string
                  ((string *)&scalar_type.member_name_cache._M_h._M_single_bucket);
      }
      else if (*(int *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt == 1) {
        if (bVar1) {
          SPIRType::SPIRType((SPIRType *)local_400,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          scalar_type.super_IVariant._12_4_ = 1;
          scalar_type.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_440,this,local_400,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (local_420,(char (*) [2])0x5e6cd2,local_440,(char (*) [2])0x5f0ee9);
          ::std::__cxx11::string::operator=(local_220,(string *)local_420);
          ::std::__cxx11::string::~string((string *)local_420);
          ::std::__cxx11::string::~string((string *)local_440);
          if (1 < *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4
                           )) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (local_480,this,target_type.member_name_cache._M_h._M_single_bucket,0);
            ::std::operator+(local_460,(char *)local_480);
            ::std::__cxx11::string::operator+=(local_200,(string *)local_460);
            ::std::__cxx11::string::~string((string *)local_460);
            ::std::__cxx11::string::~string(local_480);
          }
          SPIRType::~SPIRType((SPIRType *)local_400);
        }
        else if (1 < *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt
                              + 4)) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_4a0,this,local_180,0);
          ::std::__cxx11::string::operator=(local_200,local_4a0);
          ::std::__cxx11::string::~string(local_4a0);
          ::std::__cxx11::string::operator+=(local_200,"(");
        }
        for (local_4a4 = 0;
            local_4a4 <
            *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4);
            local_4a4 = local_4a4 + 1) {
          load_op_1._4_4_ = chain->static_index + local_4a4 * chain->matrix_stride;
          join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                    (local_4c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     (char (*) [6])".Load",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                     (char (*) [2])0x601bd3,&chain->dynamic_index,(uint *)((long)&load_op_1 + 4),
                     (char (*) [2])0x5eaa1a);
          ::std::__cxx11::string::operator+=(local_200,(string *)local_4c8);
          ::std::__cxx11::string::~string((string *)local_4c8);
          if (local_4a4 + 1 <
              *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4)) {
            ::std::__cxx11::string::operator+=(local_200,", ");
          }
        }
        if (1 < *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4))
        {
          ::std::__cxx11::string::operator+=(local_200,")");
        }
      }
      else if ((chain->row_major_matrix & 1U) == 0) {
        local_4d8 = (char *)0x0;
        switch(*(undefined4 *)
                ((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4)) {
        case 1:
          local_4d8 = "Load";
          break;
        case 2:
          local_4d8 = "Load2";
          break;
        case 3:
          local_4d8 = "Load3";
          break;
        case 4:
          local_4d8 = "Load4";
          break;
        default:
          vector_type.member_name_cache._M_h._M_single_bucket._6_1_ = 1;
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_4f8,"Unknown vector size.",
                     (allocator *)((long)&vector_type.member_name_cache._M_h._M_single_bucket + 7));
          CompilerError::CompilerError(pCVar3,(string *)local_4f8);
          vector_type.member_name_cache._M_h._M_single_bucket._6_1_ = 0;
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (bVar1) {
          SPIRType::SPIRType((SPIRType *)local_650,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          vector_type.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_690,this,local_650,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (local_670,(char (*) [2])0x5e6cd2,local_690,(char (*) [2])0x5f0ee9);
          ::std::__cxx11::string::operator=(local_220,(string *)local_670);
          ::std::__cxx11::string::~string((string *)local_670);
          ::std::__cxx11::string::~string((string *)local_690);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_6b0,this,target_type.member_name_cache._M_h._M_single_bucket,0);
          ::std::__cxx11::string::operator=(local_200,local_6b0);
          ::std::__cxx11::string::~string(local_6b0);
          local_4d8 = "Load";
          SPIRType::~SPIRType((SPIRType *)local_650);
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_6d0,this,local_180,0);
          ::std::__cxx11::string::operator=(local_200,local_6d0);
          ::std::__cxx11::string::~string(local_6d0);
        }
        ::std::__cxx11::string::operator+=(local_200,"(");
        for (local_6d4 = 0;
            local_6d4 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
            local_6d4 = local_6d4 + 1) {
          local_6fc = chain->static_index + local_6d4 * chain->matrix_stride;
          join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                    (local_6f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     (char (*) [2])0x5ea727,&local_4d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                     (char (*) [2])0x601bd3,&chain->dynamic_index,&local_6fc,(char (*) [2])0x5eaa1a)
          ;
          ::std::__cxx11::string::operator+=(local_200,(string *)local_6f8);
          ::std::__cxx11::string::~string((string *)local_6f8);
          if (local_6d4 + 1 <
              *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
            ::std::__cxx11::string::operator+=(local_200,", ");
          }
        }
        ::std::__cxx11::string::operator+=(local_200,")");
      }
      else {
        if (bVar1) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&scalar_type_1.member_name_cache._M_h._M_single_bucket,this,
                     target_type.member_name_cache._M_h._M_single_bucket,0);
          this_00 = &scalar_type_1.member_name_cache._M_h._M_single_bucket;
          ::std::__cxx11::string::operator=(local_200,(string *)this_00);
          ::std::__cxx11::string::~string((string *)this_00);
          SPIRType::SPIRType((SPIRType *)local_870,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          scalar_type_1.super_IVariant._12_4_ = 1;
          scalar_type_1.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_8b0,this,local_870,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (local_890,(char (*) [2])0x5e6cd2,local_8b0,(char (*) [2])0x5f0ee9);
          ::std::__cxx11::string::operator=(local_220,(string *)local_890);
          ::std::__cxx11::string::~string((string *)local_890);
          ::std::__cxx11::string::~string((string *)local_8b0);
          SPIRType::~SPIRType((SPIRType *)local_870);
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&r_1,this,local_180,0);
          ::std::__cxx11::string::operator=(local_200,(string *)&r_1);
          ::std::__cxx11::string::~string((string *)&r_1);
        }
        ::std::__cxx11::string::operator+=(local_200,"(");
        for (local_8d4 = 0;
            local_8d4 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
            local_8d4 = local_8d4 + 1) {
          for (local_8d8 = 0;
              local_8d8 <
              *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4);
              local_8d8 = local_8d8 + 1) {
            local_8fc = chain->static_index +
                        local_8d4 *
                        (*(uint *)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt >>
                        3) + local_8d8 * chain->matrix_stride;
            join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                      (local_8f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d8,(char (*) [6])".Load",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_220,(char (*) [2])0x601bd3,&chain->dynamic_index,&local_8fc,
                       (char (*) [2])0x5eaa1a);
            ::std::__cxx11::string::operator+=(local_200,(string *)local_8f8);
            ::std::__cxx11::string::~string((string *)local_8f8);
            if ((local_8d8 + 1 <
                 *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4)
                ) || (local_8d4 + 1 <
                      *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt)) {
              ::std::__cxx11::string::operator+=(local_200,", ");
            }
          }
        }
        ::std::__cxx11::string::operator+=(local_200,")");
      }
      if (!bVar1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])
                  (local_920,this,target_type.member_name_cache._M_h._M_single_bucket,local_180);
        uVar4 = ::std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    (local_940,local_920,(char (*) [2])0x601bd3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     (char (*) [2])0x5eaa1a);
          ::std::__cxx11::string::operator=(local_200,(string *)local_940);
          ::std::__cxx11::string::~string((string *)local_940);
        }
        ::std::__cxx11::string::~string((string *)local_920);
      }
      uVar4 = ::std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        CompilerGLSL::
        statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,lhs,(char (*) [4])0x601511,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                   (char (*) [2])0x5e9b70);
      }
      else {
        if (expr == (string *)0x0) {
          __assert_fail("expr",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_hlsl.cpp"
                        ,0x121e,
                        "void spirv_cross::CompilerHLSL::read_access_chain(string *, const string &, const SPIRAccessChain &)"
                       );
        }
        ::std::__cxx11::string::operator=((string *)expr,local_200);
      }
      ::std::__cxx11::string::~string(local_220);
      ::std::__cxx11::string::~string(local_200);
      ::std::__cxx11::string::~string(local_1d8);
      local_190 = 0;
    }
  }
  else {
    read_access_chain_array(this,lhs,chain);
    local_190 = 1;
  }
  SPIRType::~SPIRType((SPIRType *)local_180);
  return;
}

Assistant:

void CompilerHLSL::read_access_chain(string *expr, const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	SPIRType target_type;
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		read_access_chain_array(lhs, chain);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		read_access_chain_struct(lhs, chain);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	string base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	bool templated_load = hlsl_options.shader_model >= 62;
	string load_expr;

	string template_expr;
	if (templated_load)
		template_expr = join("<", type_to_glsl(type), ">");

	// Load a vector or scalar.
	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
			load_op = "Load";

		load_expr = join(base, ".", load_op, template_expr, "(", chain.dynamic_index, chain.static_index, ")");
	}
	else if (type.columns == 1)
	{
		// Strided load since we are loading a column from a row-major matrix.
		if (templated_load)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
			if (type.vecsize > 1)
				load_expr += type_to_glsl(type) + "(";
		}
		else if (type.vecsize > 1)
		{
			load_expr = type_to_glsl(target_type);
			load_expr += "(";
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
			                  chain.static_index + r * chain.matrix_stride, ")");
			if (r + 1 < type.vecsize)
				load_expr += ", ";
		}

		if (type.vecsize > 1)
			load_expr += ")";
	}
	else if (!chain.row_major_matrix)
	{
		// Load a matrix, column-major, the easy case.
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
		{
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
			load_expr = type_to_glsl(type);
			load_op = "Load";
		}
		else
		{
			// Note, this loading style in HLSL is *actually* row-major, but we always treat matrices as transposed in this backend,
			// so row-major is technically column-major ...
			load_expr = type_to_glsl(target_type);
		}
		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			load_expr += join(base, ".", load_op, template_expr, "(", chain.dynamic_index,
			                  chain.static_index + c * chain.matrix_stride, ")");
			if (c + 1 < type.columns)
				load_expr += ", ";
		}
		load_expr += ")";
	}
	else
	{
		// Pick out elements one by one ... Hopefully compilers are smart enough to recognize this pattern
		// considering HLSL is "row-major decl", but "column-major" memory layout (basically implicit transpose model, ugh) ...

		if (templated_load)
		{
			load_expr = type_to_glsl(type);
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}
		else
			load_expr = type_to_glsl(target_type);

		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			for (uint32_t r = 0; r < type.vecsize; r++)
			{
				load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
				                  chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ")");

				if ((r + 1 < type.vecsize) || (c + 1 < type.columns))
					load_expr += ", ";
			}
		}
		load_expr += ")";
	}

	if (!templated_load)
	{
		auto bitcast_op = bitcast_glsl_op(type, target_type);
		if (!bitcast_op.empty())
			load_expr = join(bitcast_op, "(", load_expr, ")");
	}

	if (lhs.empty())
	{
		assert(expr);
		*expr = std::move(load_expr);
	}
	else
		statement(lhs, " = ", load_expr, ";");
}